

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  int iVar1;
  char *zLeft;
  bool bVar2;
  int local_34;
  int n;
  char *zDb_local;
  char *zTab_local;
  char *zCol_local;
  char *zSpan_local;
  
  local_34 = 0;
  while( true ) {
    bVar2 = false;
    if (zSpan[local_34] != '\0') {
      bVar2 = zSpan[local_34] != '.';
    }
    if (!bVar2) break;
    local_34 = local_34 + 1;
  }
  if ((zDb != (char *)0x0) &&
     ((iVar1 = sqlite3_strnicmp(zSpan,zDb,local_34), iVar1 != 0 || (zDb[local_34] != '\0')))) {
    return 0;
  }
  zLeft = zSpan + (local_34 + 1);
  local_34 = 0;
  while( true ) {
    bVar2 = false;
    if (zLeft[local_34] != '\0') {
      bVar2 = zLeft[local_34] != '.';
    }
    if (!bVar2) break;
    local_34 = local_34 + 1;
  }
  if ((zTab != (char *)0x0) &&
     ((iVar1 = sqlite3_strnicmp(zLeft,zTab,local_34), iVar1 != 0 || (zTab[local_34] != '\0')))) {
    return 0;
  }
  if ((zCol != (char *)0x0) && (iVar1 = sqlite3_stricmp(zLeft + (local_34 + 1),zCol), iVar1 != 0)) {
    return 0;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}